

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_proxy_module.c
# Opt level: O0

char * ngx_http_proxy_pass(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  ngx_array_t **ppnVar1;
  ngx_int_t nVar2;
  ngx_http_upstream_srv_conf_t *pnVar3;
  undefined1 local_190 [8];
  ngx_http_script_compile_t sc;
  ngx_http_core_loc_conf_t *clcf;
  ngx_uint_t n;
  ngx_url_t u;
  ngx_str_t *url;
  ngx_str_t *value;
  u_short port;
  size_t add;
  ngx_http_proxy_loc_conf_t *plcf;
  void *conf_local;
  ngx_command_t *cmd_local;
  ngx_conf_t *cf_local;
  
  if ((*conf == 0) && (*(long *)((long)conf + 0x238) == 0)) {
    sc._80_8_ = *(long *)(*(long *)((long)cf->ctx + 0x10) + ngx_http_core_module.ctx_index * 8);
    *(code **)(sc._80_8_ + 0x48) = ngx_http_proxy_handler;
    if (*(char *)(*(long *)(sc._80_8_ + 8) + *(long *)sc._80_8_ + -1) == '/') {
      *(ushort *)(sc._80_8_ + 0x18) = *(ushort *)(sc._80_8_ + 0x18) & 0xffdf | 0x20;
    }
    u.err = (char *)((long)cf->args->elts + 0x10);
    ppnVar1 = (ngx_array_t **)ngx_http_script_variables_count((ngx_str_t *)u.err);
    if (ppnVar1 == (ngx_array_t **)0x0) {
      nVar2 = ngx_strncasecmp(*(u_char **)(u.err + 8),(u_char *)"http://",7);
      if (nVar2 == 0) {
        memset(&n,0,0xd8);
        n = *(long *)u.err - 7;
        u.url.len = *(long *)(u.err + 8) + 7;
        u.uri.data._2_2_ = 0x50;
        u.port._0_1_ = (byte)u.port & 0xf9 | 6;
        pnVar3 = ngx_http_upstream_add(cf,(ngx_url_t *)&n,0);
        *(ngx_http_upstream_srv_conf_t **)conf = pnVar3;
        if (*conf == 0) {
          cf_local = (ngx_conf_t *)0xffffffffffffffff;
        }
        else {
          *(undefined8 *)((long)conf + 0x2c0) = 7;
          *(undefined8 *)((long)conf + 0x2c8) = *(undefined8 *)(u.err + 8);
          *(undefined8 *)((long)conf + 0x2b0) = *(undefined8 *)((long)conf + 0x2c0);
          *(undefined8 *)((long)conf + 0x2b8) = *(undefined8 *)((long)conf + 0x2c8);
          ngx_http_proxy_set_vars((ngx_url_t *)&n,(ngx_http_proxy_vars_t *)((long)conf + 0x2b0));
          *(undefined8 *)((long)conf + 0x268) = *(undefined8 *)sc._80_8_;
          *(undefined8 *)((long)conf + 0x270) = *(undefined8 *)(sc._80_8_ + 8);
          if ((((*(ushort *)(sc._80_8_ + 0x18) >> 2 & 1) != 0) || (*(long *)(sc._80_8_ + 0x10) != 0)
              ) || ((*(ushort *)(sc._80_8_ + 0x18) & 1) != 0)) {
            if (*(long *)((long)conf + 0x2f0) != 0) {
              ngx_conf_log_error(1,cf,0,
                                 "\"proxy_pass\" cannot have URI part in location given by regular expression, or inside named location, or inside \"if\" statement, or inside \"limit_except\" block"
                                );
              return (char *)0xffffffffffffffff;
            }
            *(undefined8 *)((long)conf + 0x268) = 0;
          }
          *(undefined8 *)((long)conf + 0x278) = *(undefined8 *)u.err;
          *(undefined8 *)((long)conf + 0x280) = *(undefined8 *)(u.err + 8);
          cf_local = (ngx_conf_t *)0x0;
        }
      }
      else {
        nVar2 = ngx_strncasecmp(*(u_char **)(u.err + 8),(u_char *)"https://",8);
        if (nVar2 == 0) {
          ngx_conf_log_error(1,cf,0,"https protocol requires SSL support");
          cf_local = (ngx_conf_t *)0xffffffffffffffff;
        }
        else {
          ngx_conf_log_error(1,cf,0,"invalid URL prefix");
          cf_local = (ngx_conf_t *)0xffffffffffffffff;
        }
      }
    }
    else {
      memset(local_190,0,0x58);
      sc.cf = (ngx_conf_t *)u.err;
      sc.flushes = (ngx_array_t **)((long)conf + 0x238);
      sc.lengths = (ngx_array_t **)((long)conf + 0x240);
      sc.main._0_1_ = (byte)sc.main & 0xf9 | 6;
      local_190 = (undefined1  [8])cf;
      sc.values = ppnVar1;
      nVar2 = ngx_http_script_compile((ngx_http_script_compile_t *)local_190);
      if (nVar2 == 0) {
        cf_local = (ngx_conf_t *)0x0;
      }
      else {
        cf_local = (ngx_conf_t *)0xffffffffffffffff;
      }
    }
  }
  else {
    cf_local = (ngx_conf_t *)anon_var_dwarf_1243;
  }
  return (char *)cf_local;
}

Assistant:

static char *
ngx_http_proxy_pass(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_proxy_loc_conf_t *plcf = conf;

    size_t                      add;
    u_short                     port;
    ngx_str_t                  *value, *url;
    ngx_url_t                   u;
    ngx_uint_t                  n;
    ngx_http_core_loc_conf_t   *clcf;
    ngx_http_script_compile_t   sc;

    if (plcf->upstream.upstream || plcf->proxy_lengths) {
        return "is duplicate";
    }

    clcf = ngx_http_conf_get_module_loc_conf(cf, ngx_http_core_module);

    clcf->handler = ngx_http_proxy_handler;

    if (clcf->name.data[clcf->name.len - 1] == '/') {
        clcf->auto_redirect = 1;
    }

    value = cf->args->elts;

    url = &value[1];

    n = ngx_http_script_variables_count(url);

    if (n) {

        ngx_memzero(&sc, sizeof(ngx_http_script_compile_t));

        sc.cf = cf;
        sc.source = url;
        sc.lengths = &plcf->proxy_lengths;
        sc.values = &plcf->proxy_values;
        sc.variables = n;
        sc.complete_lengths = 1;
        sc.complete_values = 1;

        if (ngx_http_script_compile(&sc) != NGX_OK) {
            return NGX_CONF_ERROR;
        }

#if (NGX_HTTP_SSL)
        plcf->ssl = 1;
#endif

        return NGX_CONF_OK;
    }

    if (ngx_strncasecmp(url->data, (u_char *) "http://", 7) == 0) {
        add = 7;
        port = 80;

    } else if (ngx_strncasecmp(url->data, (u_char *) "https://", 8) == 0) {

#if (NGX_HTTP_SSL)
        plcf->ssl = 1;

        add = 8;
        port = 443;
#else
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                           "https protocol requires SSL support");
        return NGX_CONF_ERROR;
#endif

    } else {
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0, "invalid URL prefix");
        return NGX_CONF_ERROR;
    }

    ngx_memzero(&u, sizeof(ngx_url_t));

    u.url.len = url->len - add;
    u.url.data = url->data + add;
    u.default_port = port;
    u.uri_part = 1;
    u.no_resolve = 1;

    plcf->upstream.upstream = ngx_http_upstream_add(cf, &u, 0);
    if (plcf->upstream.upstream == NULL) {
        return NGX_CONF_ERROR;
    }

    plcf->vars.schema.len = add;
    plcf->vars.schema.data = url->data;
    plcf->vars.key_start = plcf->vars.schema;

    ngx_http_proxy_set_vars(&u, &plcf->vars);

    plcf->location = clcf->name;

    if (clcf->named
#if (NGX_PCRE)
        || clcf->regex
#endif
        || clcf->noname)
    {
        if (plcf->vars.uri.len) {
            ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                               "\"proxy_pass\" cannot have URI part in "
                               "location given by regular expression, "
                               "or inside named location, "
                               "or inside \"if\" statement, "
                               "or inside \"limit_except\" block");
            return NGX_CONF_ERROR;
        }

        plcf->location.len = 0;
    }

    plcf->url = *url;

    return NGX_CONF_OK;
}